

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall
pbrt::SingleLevelFlattener::SingleLevelFlattener(SingleLevelFlattener *this,SP *world)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  pointer psVar3;
  pointer psVar4;
  shared_ptr<pbrt::LightSource> lightSource;
  SP local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined8 local_58;
  undefined1 auStack_50 [16];
  undefined8 uStack_40;
  
  (this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_70 = &(this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::Object,std::allocator<pbrt::Object>>
            (local_70,(Object **)this,(allocator<pbrt::Object> *)local_68);
  std::__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::Object,pbrt::Object>
            ((__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2> *)this,
             (this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  p_Var1 = &(this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar2 = (world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar4 = (peVar2->lightSources).
           super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (peVar2->lightSources).
           super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar3) {
    do {
      local_68 = (undefined1  [8])
                 (psVar4->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      _Stack_60._M_pi =
           (psVar4->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
      ::push_back(&((this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->lightSources,(value_type *)local_68);
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar3);
  }
  local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_68 = (undefined1  [8])0x3f800000;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._0_4_ = 1.0;
  local_58._4_4_ = 0.0;
  auStack_50._0_4_ = 0.0;
  auStack_50._4_4_ = 0.0;
  auStack_50._8_4_ = 1.0;
  auStack_50._12_4_ = 0.0;
  uStack_40._0_4_ = 0.0;
  uStack_40._4_4_ = 0.0;
  traverse(this,&local_80,(affine3f *)local_68);
  if (local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>::
  operator=(&((this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             lightSources,
            &((world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             lightSources);
  return;
}

Assistant:

SingleLevelFlattener(Object::SP world)
      : result(std::make_shared<Object>())
    {
      for (auto lightSource : world->lightSources)
        result->lightSources.push_back(lightSource);
      traverse(world, affine3f::identity());
      result->lightSources = world->lightSources;
    }